

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevmousehandler.cpp
# Opt level: O3

void __thiscall QEvdevMouseHandler::~QEvdevMouseHandler(QEvdevMouseHandler *this)

{
  int __fd;
  int iVar1;
  int *piVar2;
  
  *(undefined ***)this = &PTR_metaObject_00145930;
  __fd = *(int *)(this + 0x28);
  if (-1 < __fd) {
    do {
      iVar1 = close(__fd);
      if (iVar1 != -1) break;
      piVar2 = __errno_location();
    } while (*piVar2 == 4);
  }
  piVar2 = *(int **)(this + 0x10);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      QArrayData::deallocate(*(QArrayData **)(this + 0x10),2,0x10);
    }
  }
  QObject::~QObject((QObject *)this);
  return;
}

Assistant:

QEvdevMouseHandler::~QEvdevMouseHandler()
{
    if (m_fd >= 0)
        qt_safe_close(m_fd);
}